

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O1

MemoryMapT * __thiscall dg::pta::PointerAnalysisFS::createMM(PointerAnalysisFS *this)

{
  pointer *ppuVar1;
  iterator __position;
  _Rb_tree_header *p_Var2;
  MemoryMapT *mm;
  _Head_base<0UL,_std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_*,_false>
  local_10;
  
  local_10._M_head_impl =
       (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
        *)operator_new(0x30);
  p_Var2 = (_Rb_tree_header *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 8);
  *(_Base_ptr *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x20) = (_Base_ptr)0x0;
  *(size_t *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x28) = 0;
  *(undefined8 *)&((local_10._M_head_impl)->_M_t)._M_impl = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 8))->_M_header = 0;
  *(_Rb_tree_header **)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x18) = p_Var2;
  *(_Rb_tree_header **)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x20) = p_Var2;
  *(size_t *)((long)&((local_10._M_head_impl)->_M_t)._M_impl + 0x28) = 0;
  __position._M_current =
       (this->memoryMaps).
       super__Vector_base<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->memoryMaps).
      super__Vector_base<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>,std::default_delete<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>>,std::allocator<std::unique_ptr<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>,std::default_delete<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>>>>
    ::
    _M_realloc_insert<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>*&>
              ((vector<std::unique_ptr<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>,std::default_delete<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>>,std::allocator<std::unique_ptr<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>,std::default_delete<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>>>>
                *)&this->memoryMaps,__position,&local_10._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_*,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>
    .
    super__Head_base<0UL,_std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_*,_false>
    ._M_head_impl = local_10._M_head_impl;
    ppuVar1 = &(this->memoryMaps).
               super__Vector_base<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return local_10._M_head_impl;
}

Assistant:

MemoryMapT *createMM() {
        MemoryMapT *mm = new MemoryMapT();
        memoryMaps.emplace_back(mm);
        return mm;
    }